

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw_image.cxx
# Opt level: O0

void fl_rectf(int x,int y,int w,int h,uchar r,uchar g,uchar b)

{
  uchar local_1d;
  uchar local_1c;
  uchar local_1b;
  uchar local_1a;
  uchar local_19;
  undefined1 auStack_18 [3];
  uchar c [3];
  uchar g_local;
  uchar r_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  
  local_1a = g;
  local_19 = r;
  _auStack_18 = h;
  unique0x100000d5 = w;
  if (fl_visual->depth < 0x11) {
    local_1b = b;
    local_1d = r;
    local_1c = g;
    innards(&local_1d,x,y,w,h,0,0,0,(Fl_Draw_Image_Cb)0x0,(void *)0x0,false);
  }
  else {
    fl_color(r,g,b);
    fl_rectf(x,y,stack0xffffffffffffffec,_auStack_18);
  }
  return;
}

Assistant:

void fl_rectf(int x, int y, int w, int h, uchar r, uchar g, uchar b) {
  if (fl_visual->depth > 16) {
    fl_color(r,g,b);
    fl_rectf(x,y,w,h);
  } else {
    uchar c[3];
    c[0] = r; c[1] = g; c[2] = b;
    innards(c,x,y,w,h,0,0,0,0,0,0);
  }
}